

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O0

bool anon_unknown.dwarf_47aea5::EqualDescriptor(string *a,string *b)

{
  long lVar1;
  __type_conflict _Var2;
  size_type sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  bool b_check;
  bool a_check;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  byte bVar5;
  undefined5 in_stack_ffffffffffffffa0;
  undefined1 uVar6;
  byte bVar7;
  byte bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __pos = in_RSI;
  this = in_RDI;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  uVar6 = false;
  if (9 < sVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff8f,
                        CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_RSI,(size_type)in_RDI);
    uVar6 = *pvVar4 == '#';
  }
  bVar8 = uVar6;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
  bVar5 = false;
  if (9 < sVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88));
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_RSI,(size_type)in_RDI);
    bVar5 = *pvVar4 == '#';
  }
  if ((bVar8 & 1) != bVar5) {
    bVar7 = bVar5;
    if ((bVar8 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (this,(size_type)__pos,
                 CONCAT17(bVar8,CONCAT16(bVar7,CONCAT15(uVar6,in_stack_ffffffffffffffa0))));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
    }
    if ((bVar7 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (this,(size_type)__pos,
                 CONCAT17(bVar8,CONCAT16(bVar7,CONCAT15(uVar6,in_stack_ffffffffffffffa0))));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
    }
  }
  _Var2 = std::operator==(in_stack_ffffffffffffffb8,this);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return _Var2;
}

Assistant:

bool EqualDescriptor(std::string a, std::string b)
{
    bool a_check = (a.size() > 9 && a[a.size() - 9] == '#');
    bool b_check = (b.size() > 9 && b[b.size() - 9] == '#');
    if (a_check != b_check) {
        if (a_check) a = a.substr(0, a.size() - 9);
        if (b_check) b = b.substr(0, b.size() - 9);
    }
    return a == b;
}